

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

Attribute * Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::makeNewAttribute(void)

{
  Attribute *pAVar1;
  TypedAttribute<Imath_2_5::Matrix44<float>_> *unaff_retaddr;
  
  pAVar1 = (Attribute *)operator_new(0x48);
  pAVar1[6]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[7]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[4]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[5]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[2]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[3]._vptr_Attribute = (_func_int **)0x0;
  pAVar1->_vptr_Attribute = (_func_int **)0x0;
  pAVar1[1]._vptr_Attribute = (_func_int **)0x0;
  pAVar1[8]._vptr_Attribute = (_func_int **)0x0;
  TypedAttribute(unaff_retaddr);
  return pAVar1;
}

Assistant:

Attribute *
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T>();
}